

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O1

void lsvm::hashmap::free(void *__ptr)

{
  ushort uVar1;
  ulong uVar2;
  
  uVar1 = *(ushort *)((long)__ptr + 0x16);
  uVar2 = 0xffffffffffffffff;
  do {
    free_bucket(*(hashbucket **)((long)__ptr + uVar2 * 8 + 0x28));
    uVar2 = uVar2 + 1;
  } while (uVar1 != uVar2);
  memory::retain(__ptr);
  return;
}

Assistant:

void free(hashmap* h){
    // calculate current max partitions
    uint32_t max_partitions = partition_count(h->bits);

    // free all buckets
    uint32_t i = 0;
    hashbucket** bp = buckets(h);
    while(i < max_partitions){
        free_bucket(bp[i]);    
        ++i;
    }

    // free hashmap
    lsvm::memory::retain(h);
}